

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined2 *puVar13;
  bool bVar14;
  
  if (bmi2 != 0) {
    sVar3 = HUF_decompress1X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar3;
  }
  if (cSrcSize == 0) {
    return 0xfffffffffffffffd;
  }
  if (cSrcSize < 8) {
    uVar7 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar7 = uVar7 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar5 == 0) {
      return 0xfffffffffffffffc;
    }
    uVar8 = 0x1f;
    if (bVar5 != 0) {
      for (; bVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (uVar8 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    lVar4 = 0;
  }
  else {
    bVar5 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar5 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xfffffffffffffff7 < cSrcSize) {
      return cSrcSize;
    }
    uVar7 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    lVar4 = cSrcSize - 8;
    uVar8 = 0x1f;
    if (bVar5 != 0) {
      for (; bVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = ~uVar8 + 9;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  puVar13 = (undefined2 *)((long)dst + (dstSize - 7));
  bVar5 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
  do {
    if (lVar4 < 8) {
      if (lVar4 != 0) {
        uVar6 = uVar8 >> 3;
        bVar14 = cSrc <= (void *)((long)cSrc + (lVar4 - (ulong)uVar6));
        if (!bVar14) {
          uVar6 = (uint)lVar4;
        }
        uVar8 = uVar8 + uVar6 * -8;
        goto LAB_001846cc;
      }
      lVar4 = 0;
LAB_001847c4:
      goto LAB_001847c8;
    }
    uVar6 = uVar8 >> 3;
    uVar8 = uVar8 & 7;
    bVar14 = true;
LAB_001846cc:
    lVar4 = lVar4 - (ulong)uVar6;
    uVar7 = *(ulong *)((long)cSrc + lVar4);
    if ((puVar13 <= dst) || (!bVar14)) goto LAB_001847c4;
    uVar11 = (uVar7 << ((byte)uVar8 & 0x3f)) >> bVar5;
    *(short *)dst = (short)DTable[uVar11 + 1];
    iVar10 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar8;
    uVar12 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
    uVar11 = (uVar7 << ((byte)iVar10 & 0x3f)) >> bVar5;
    *(short *)((long)dst + uVar12) = (short)DTable[uVar11 + 1];
    iVar10 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar10;
    uVar9 = (uVar7 << ((byte)iVar10 & 0x3f)) >> bVar5;
    uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
    lVar2 = uVar11 + uVar12;
    *(short *)((long)dst + uVar11 + uVar12) = (short)DTable[uVar9 + 1];
    iVar10 = (uint)*(byte *)((long)DTable + uVar9 * 4 + 6) + iVar10;
    uVar11 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
    uVar12 = (uVar7 << ((byte)iVar10 & 0x3f)) >> bVar5;
    *(short *)((long)dst + uVar11 + lVar2) = (short)DTable[uVar12 + 1];
    uVar8 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + iVar10;
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7) + uVar11 + lVar2);
  } while (uVar8 < 0x41);
LAB_00184886:
  for (; dst <= puVar1 + -1;
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7))) {
    uVar11 = (uVar7 << ((byte)uVar8 & 0x3f)) >> bVar5;
    *(short *)dst = (short)DTable[uVar11 + 1];
    uVar8 = uVar8 + *(byte *)((long)DTable + uVar11 * 4 + 6);
  }
  if (dst < puVar1) {
    uVar7 = (uVar7 << ((byte)uVar8 & 0x3f)) >> bVar5;
    *(char *)dst = (char)DTable[uVar7 + 1];
    if (*(char *)((long)DTable + uVar7 * 4 + 7) == '\x01') {
      uVar8 = uVar8 + *(byte *)((long)DTable + uVar7 * 4 + 6);
    }
    else if ((uVar8 < 0x40) &&
            (uVar8 = uVar8 + *(byte *)((long)DTable + uVar7 * 4 + 6), 0x3f < uVar8)) {
      uVar8 = 0x40;
    }
  }
  if (uVar8 != 0x40) {
    dstSize = 0xfffffffffffffffc;
  }
  if (lVar4 != 0) {
    dstSize = 0xfffffffffffffffc;
  }
  return dstSize;
LAB_001847c8:
  if (0x40 < uVar8) goto LAB_00184886;
  if (lVar4 < 8) {
    if (lVar4 == 0) {
      lVar4 = 0;
      goto LAB_00184886;
    }
    uVar6 = uVar8 >> 3;
    bVar14 = cSrc <= (void *)((long)cSrc + (lVar4 - (ulong)uVar6));
    if (!bVar14) {
      uVar6 = (uint)lVar4;
    }
    uVar8 = uVar8 + uVar6 * -8;
  }
  else {
    uVar6 = uVar8 >> 3;
    uVar8 = uVar8 & 7;
    bVar14 = true;
  }
  lVar4 = lVar4 - (ulong)uVar6;
  uVar7 = *(ulong *)((long)cSrc + lVar4);
  if ((puVar1 + -1 < dst) || (!bVar14)) goto LAB_00184886;
  uVar11 = (uVar7 << ((byte)uVar8 & 0x3f)) >> bVar5;
  *(short *)dst = (short)DTable[uVar11 + 1];
  uVar8 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar8;
  dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7));
  goto LAB_001847c8;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}